

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O3

int Bac_CommandClp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Bac_Man_t *pBVar3;
  char *pcVar4;
  
  pBVar3 = (Bac_Man_t *)pAbc->pAbcBac;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (pBVar3 == (Bac_Man_t *)0x0) {
      iVar2 = 0;
      Abc_Print(1,"Bac_CommandGet(): There is no current design.\n");
    }
    else {
      pBVar3 = Bac_ManCollapse(pBVar3);
      if ((Bac_Man_t *)pAbc->pAbcBac != (Bac_Man_t *)0x0) {
        Bac_ManFree((Bac_Man_t *)pAbc->pAbcBac);
      }
      pAbc->pAbcBac = pBVar3;
      iVar2 = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: @_clp [-vh]\n");
    Abc_Print(-2,"\t         collapses the current hierarchical design\n");
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Bac_CommandClp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * pNew = NULL, * p = Bac_AbcGetMan(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandGet(): There is no current design.\n" );
        return 0;
    }
    pNew = Bac_ManCollapse( p );
    Bac_AbcUpdateMan( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: @_clp [-vh]\n" );
    Abc_Print( -2, "\t         collapses the current hierarchical design\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}